

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::emplace<QSocks5RevivedDatagram_const&>
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,qsizetype i,QSocks5RevivedDatagram *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QSocks5RevivedDatagram> *in_RSI;
  QArrayDataPointer<QSocks5RevivedDatagram> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QSocks5RevivedDatagram tmp;
  QSocks5RevivedDatagram *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff64;
  byte bVar6;
  GrowthPosition where;
  Inserter local_80;
  undefined1 local_30 [40];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QSocks5RevivedDatagram>::needsDetach
                    ((QArrayDataPointer<QSocks5RevivedDatagram> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QSocks5RevivedDatagram> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QSocks5RevivedDatagram>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QSocks5RevivedDatagram>::end
                ((QArrayDataPointer<QSocks5RevivedDatagram> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      QSocks5RevivedDatagram::QSocks5RevivedDatagram
                ((QSocks5RevivedDatagram *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00379b02;
    }
    if ((in_RSI == (QArrayDataPointer<QSocks5RevivedDatagram> *)0x0) &&
       (qVar3 = QArrayDataPointer<QSocks5RevivedDatagram>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QSocks5RevivedDatagram>::begin
                ((QArrayDataPointer<QSocks5RevivedDatagram> *)0x3799ca);
      QSocks5RevivedDatagram::QSocks5RevivedDatagram
                ((QSocks5RevivedDatagram *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00379b02;
    }
  }
  memset(local_30,0xaa,0x28);
  QSocks5RevivedDatagram::QSocks5RevivedDatagram
            ((QSocks5RevivedDatagram *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
             ,in_stack_ffffffffffffff48);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QSocks5RevivedDatagram> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QSocks5RevivedDatagram> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QSocks5RevivedDatagram>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff64,uVar2))),
             (QSocks5RevivedDatagram **)in_RDI,
             (QArrayDataPointer<QSocks5RevivedDatagram> *)CONCAT17(uVar5,in_stack_ffffffffffffff50))
  ;
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_80,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff64,uVar2))),
                        (qsizetype)in_RDI,
                        (QSocks5RevivedDatagram *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
    Inserter::~Inserter(&local_80);
  }
  else {
    QArrayDataPointer<QSocks5RevivedDatagram>::begin
              ((QArrayDataPointer<QSocks5RevivedDatagram> *)0x379a92);
    QSocks5RevivedDatagram::QSocks5RevivedDatagram
              ((QSocks5RevivedDatagram *)CONCAT17(uVar5,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QSocks5RevivedDatagram::~QSocks5RevivedDatagram
            ((QSocks5RevivedDatagram *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
LAB_00379b02:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }